

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_matcher.cpp
# Opt level: O3

idx_t duckdb::TemplatedMatch<true,signed_char,duckdb::NotDistinctFrom>
                (Vector *param_1,TupleDataVectorFormat *lhs_format,SelectionVector *sel,idx_t count,
                TupleDataLayout *rhs_layout,Vector *rhs_row_locations,idx_t col_idx,
                vector<duckdb::MatchFunction,_true> *param_8,SelectionVector *no_match_sel,
                idx_t *no_match_count)

{
  data_ptr_t pdVar1;
  SelectionVector *pSVar2;
  data_ptr_t pdVar3;
  value_type vVar4;
  sel_t *psVar5;
  sel_t *psVar6;
  unsigned_long *puVar7;
  const_reference pvVar8;
  idx_t iVar9;
  uint uVar10;
  idx_t iVar11;
  idx_t iVar12;
  idx_t iVar13;
  idx_t iVar14;
  char *lhs_data;
  uchar **rhs_locations;
  bool bVar15;
  SelectionVector *lhs_sel;
  
  if ((lhs_format->unified).validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
      (unsigned_long *)0x0) {
    pSVar2 = (lhs_format->unified).sel;
    pdVar1 = (lhs_format->unified).data;
    pdVar3 = rhs_row_locations->data;
    pvVar8 = vector<unsigned_long,_true>::operator[](&rhs_layout->offsets,col_idx);
    if (count != 0) {
      vVar4 = *pvVar8;
      psVar5 = sel->sel_vector;
      psVar6 = pSVar2->sel_vector;
      iVar9 = 0;
      iVar13 = 0;
      iVar11 = *no_match_count;
      do {
        iVar14 = iVar13;
        if (psVar5 != (sel_t *)0x0) {
          iVar14 = (idx_t)psVar5[iVar13];
        }
        iVar12 = iVar14;
        if (psVar6 != (sel_t *)0x0) {
          iVar12 = (idx_t)psVar6[iVar14];
        }
        if (((1 << ((byte)col_idx & 7) &
             (uint)*(byte *)(*(long *)(pdVar3 + iVar14 * 8) + (col_idx >> 3))) == 0) ||
           (pdVar1[iVar12] != *(data_t *)(*(long *)(pdVar3 + iVar14 * 8) + vVar4))) {
          iVar12 = iVar11 + 1;
          *no_match_count = iVar12;
          no_match_sel->sel_vector[iVar11] = (sel_t)iVar14;
        }
        else {
          psVar5[iVar9] = (sel_t)iVar14;
          iVar9 = iVar9 + 1;
          iVar12 = iVar11;
        }
        iVar13 = iVar13 + 1;
        iVar11 = iVar12;
      } while (count != iVar13);
      return iVar9;
    }
  }
  else {
    pdVar1 = rhs_row_locations->data;
    pSVar2 = (lhs_format->unified).sel;
    pdVar3 = (lhs_format->unified).data;
    pvVar8 = vector<unsigned_long,_true>::operator[](&rhs_layout->offsets,col_idx);
    if (count != 0) {
      vVar4 = *pvVar8;
      iVar11 = *no_match_count;
      psVar5 = sel->sel_vector;
      psVar6 = pSVar2->sel_vector;
      puVar7 = (lhs_format->unified).validity.super_TemplatedValidityMask<unsigned_long>.
               validity_mask;
      iVar9 = 0;
      iVar13 = 0;
      do {
        iVar14 = iVar13;
        if (psVar5 != (sel_t *)0x0) {
          iVar14 = (idx_t)psVar5[iVar13];
        }
        iVar12 = iVar14;
        if (psVar6 != (sel_t *)0x0) {
          iVar12 = (idx_t)psVar6[iVar14];
        }
        if (puVar7 == (unsigned_long *)0x0) {
          bVar15 = false;
        }
        else {
          bVar15 = (puVar7[iVar12 >> 6] >> (iVar12 & 0x3f) & 1) == 0;
        }
        uVar10 = (uint)*(byte *)(*(long *)(pdVar1 + iVar14 * 8) + (col_idx >> 3)) &
                 1 << ((byte)col_idx & 7);
        if ((bVar15 == false) && (uVar10 != 0)) {
          if (pdVar3[iVar12] != *(data_t *)(*(long *)(pdVar1 + iVar14 * 8) + vVar4))
          goto LAB_012860d9;
LAB_01286100:
          psVar5[iVar9] = (sel_t)iVar14;
          iVar9 = iVar9 + 1;
        }
        else {
          if (bVar15 == (uVar10 == 0)) goto LAB_01286100;
LAB_012860d9:
          *no_match_count = iVar11 + 1;
          no_match_sel->sel_vector[iVar11] = (sel_t)iVar14;
          iVar11 = iVar11 + 1;
        }
        iVar13 = iVar13 + 1;
        if (count == iVar13) {
          return iVar9;
        }
      } while( true );
    }
  }
  return 0;
}

Assistant:

static idx_t TemplatedMatch(Vector &, const TupleDataVectorFormat &lhs_format, SelectionVector &sel, const idx_t count,
                            const TupleDataLayout &rhs_layout, Vector &rhs_row_locations, const idx_t col_idx,
                            const vector<MatchFunction> &, SelectionVector *no_match_sel, idx_t &no_match_count) {
	if (lhs_format.unified.validity.AllValid()) {
		return TemplatedMatchLoop<NO_MATCH_SEL, T, OP, true>(lhs_format, sel, count, rhs_layout, rhs_row_locations,
		                                                     col_idx, no_match_sel, no_match_count);
	} else {
		return TemplatedMatchLoop<NO_MATCH_SEL, T, OP, false>(lhs_format, sel, count, rhs_layout, rhs_row_locations,
		                                                      col_idx, no_match_sel, no_match_count);
	}
}